

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_gather.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_40;
  int local_3c;
  int val_of_three;
  int val_of_two;
  int val_of_one;
  int kvtree_rc;
  int ranks;
  int rank;
  kvtree *send;
  kvtree *recv;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  recv = (kvtree *)argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&recv);
  MPI_Comm_rank(&ompi_mpi_comm_world,&kvtree_rc);
  MPI_Comm_size(&ompi_mpi_comm_world,&val_of_one);
  if (val_of_one == 3) {
    _ranks = kvtree_new();
    send = (kvtree *)kvtree_new();
    if (kvtree_rc == 0) {
      kvtree_util_set_int(_ranks,"ONE",1);
      kvtree_util_set_int(_ranks,"TWO",2);
    }
    if (kvtree_rc == 2) {
      kvtree_util_set_int(_ranks,"ONE",0xffffffff);
      kvtree_util_set_int(_ranks,"THREE",3);
    }
    val_of_two = kvtree_write_gather("PREFIX",_ranks,&ompi_mpi_comm_world);
    if (val_of_two == 0) {
      val_of_two = kvtree_read_scatter("PREFIX",send,&ompi_mpi_comm_world);
      if (val_of_two == 0) {
        if (send == (kvtree *)0x0) {
          printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
          printf("Error in line %d, file %s, function %s.\n",0x31,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                 ,"main");
          argv_local._4_4_ = 1;
        }
        else {
          printf("rank=%d, send\n",(ulong)(uint)kvtree_rc);
          kvtree_print(_ranks,4);
          printf("rank=%d, recv\n",(ulong)(uint)kvtree_rc);
          kvtree_print(send,4);
          if (kvtree_rc == 0) {
            val_of_two = kvtree_util_get_int(send,"ONE",&val_of_three);
            if (val_of_two != 0) {
              printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' failed");
              printf("Error in line %d, file %s, function %s.\n",0x3c,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            if (val_of_three != 1) {
              printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' returned wrong value");
              printf("Error in line %d, file %s, function %s.\n",0x41,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            val_of_two = kvtree_util_get_int(send,"TWO",&local_3c);
            if (val_of_two != 0) {
              printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' failed");
              printf("Error in line %d, file %s, function %s.\n",0x47,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            if (local_3c != 2) {
              printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' returned wrong value");
              printf("Error in line %d, file %s, function %s.\n",0x4c,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            val_of_two = 0;
          }
          if (kvtree_rc == 2) {
            val_of_two = kvtree_util_get_int(send,"ONE",&val_of_three);
            if (val_of_two != 0) {
              printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' failed");
              printf("Error in line %d, file %s, function %s.\n",0x54,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            if (val_of_three != -1) {
              printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' returned wrong value");
              printf("Error in line %d, file %s, function %s.\n",0x59,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            val_of_two = kvtree_util_get_int(send,"THREE",&local_40);
            if (val_of_two != 0) {
              printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' failed");
              printf("Error in line %d, file %s, function %s.\n",0x5f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            if (local_40 != 3) {
              printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' returned wrong value"
                    );
              printf("Error in line %d, file %s, function %s.\n",100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              return 1;
            }
            val_of_two = 0;
          }
          if ((kvtree_rc == 1) && (iVar1 = kvtree_size(send), iVar1 != 0)) {
            printf(
                  "test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive"
                  );
            printf("Error in line %d, file %s, function %s.\n",0x6b,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                   ,"main");
            argv_local._4_4_ = 1;
          }
          else {
            kvtree_delete(&ranks);
            if (_ranks == 0) {
              kvtree_delete(&send);
              if (send == (kvtree *)0x0) {
                MPI_Finalize();
                argv_local._4_4_ = 0;
              }
              else {
                printf("deletion of recv failed");
                printf("Error in line %d, file %s, function %s.\n",0x78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                       ,"main");
                argv_local._4_4_ = 1;
              }
            }
            else {
              printf("test_kvtree_write_gather, deletion of kvtree failed");
              printf("Error in line %d, file %s, function %s.\n",0x72,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
                     ,"main");
              argv_local._4_4_ = 1;
            }
          }
        }
      }
      else {
        printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
        printf("Error in line %d, file %s, function %s.\n",0x2c,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
               ,"main");
        argv_local._4_4_ = 1;
      }
    }
    else {
      printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
      printf("Error in line %d, file %s, function %s.\n",0x26,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
             ,"main");
      argv_local._4_4_ = 1;
    }
  }
  else {
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n",
           (ulong)(uint)val_of_one);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv){
  kvtree* recv;
  kvtree* send;
  //int rc = TEST_PASS;
  int rank, ranks, kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }

  send = kvtree_new();
  recv = kvtree_new();
  if(rank == 0){
    kvtree_util_set_int(send, "ONE", 1);
    kvtree_util_set_int(send, "TWO", 2);
  }
  if(rank == 2){
    kvtree_util_set_int(send, "ONE", -1);
    kvtree_util_set_int(send, "THREE", 3);
  }

  kvtree_rc = kvtree_write_gather("PREFIX", send, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_read_scatter("PREFIX", recv, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if (recv == NULL){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  printf("rank=%d, send\n", rank);
  kvtree_print(send, 4);
  printf("rank=%d, recv\n", rank);
  kvtree_print(recv, 4);
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != 1){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_two != 2){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != -1){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_three != 3){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank ==1){
    if(kvtree_size(recv) != 0){
      printf("test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_write_gather, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }

  MPI_Finalize();
  return TEST_PASS;
}